

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const(&)[2],kj::String&,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [2],String *params_1,
          char (*params_2) [2])

{
  char (*pacVar1) [2];
  String *value;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  String *local_28;
  char (*params_local_2) [2];
  String *params_local_1;
  char (*params_local) [2];
  
  local_28 = params_1;
  params_local_2 = params;
  params_local_1 = (String *)this;
  params_local = (char (*) [2])__return_storage_ptr__;
  pacVar1 = ::const((char (*) [2])this);
  local_38 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar1);
  value = fwd<kj::String&>((String *)params_local_2);
  local_48 = _::toStringTreeOrCharSequence<kj::String&>(value);
  pacVar1 = ::const((char (*) [2])local_28);
  local_58 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar1);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}